

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

void conn_free(conn_handle *conn)

{
  void *pvVar1;
  conn_priv *priv;
  conn_handle *conn_local;
  
  if (conn->priv != (void *)0x0) {
    pvVar1 = conn->priv;
    conn_close(conn);
    mutex_free((mutex_handle *)((long)pvVar1 + 0x90));
    free(conn->priv);
    conn->priv = (void *)0x0;
  }
  return;
}

Assistant:

void conn_free(struct conn_handle *conn)
{
	if (conn->priv != NULL) {
		struct conn_priv *priv = conn->priv;

		conn_close(conn);

#ifdef _WIN32
		WSACleanup();
#endif

		mutex_free(&priv->mutex);

		free(conn->priv);
		conn->priv = NULL;
	}
}